

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImStb::stb_textedit_clamp(ImGuiInputTextState *str,STB_TexteditState *state)

{
  int iVar1;
  
  iVar1 = str->CurLenW;
  if (state->select_start != state->select_end) {
    if (iVar1 < state->select_start) {
      state->select_start = iVar1;
    }
    if (iVar1 < state->select_end) {
      state->select_end = iVar1;
    }
    if (state->select_start == state->select_end) {
      state->cursor = state->select_start;
    }
  }
  if (iVar1 < state->cursor) {
    state->cursor = iVar1;
  }
  return;
}

Assistant:

static int     STB_TEXTEDIT_STRINGLEN(const ImGuiInputTextState* obj)                             { return obj->CurLenW; }